

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score_test.cc
# Opt level: O0

void __thiscall xLearn::LinearScoreTest::LinearScoreTest(LinearScoreTest *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__LinearScoreTest_001911b0;
  return;
}

Assistant:

virtual void SetUp() {
    param.learning_rate = 0.1;
    param.regu_lambda = 0;
    param.num_param = kLength;
    param.loss_func = "squared";
    param.score_func = "linear";
    param.num_feature = kLength;
  }